

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# insert_ordered.h
# Opt level: O3

Counts * __thiscall
wasm::InsertOrderedMap<wasm::Function_*,_wasm::ModuleUtils::(anonymous_namespace)::Counts>::
operator[](InsertOrderedMap<wasm::Function_*,_wasm::ModuleUtils::(anonymous_namespace)::Counts>
           *this,Function **k)

{
  InsertOrderedMap<wasm::Function_*,_wasm::ModuleUtils::(anonymous_namespace)::Counts> *pIVar1;
  _List_node_base *p_Var2;
  Function **ppFVar3;
  long *plVar4;
  _Hash_node_base *p_Var5;
  InsertOrderedMap<wasm::Function_*,_wasm::ModuleUtils::(anonymous_namespace)::Counts> *__s;
  InsertOrderedMap<wasm::Function_*,_wasm::ModuleUtils::(anonymous_namespace)::Counts> *pIVar6;
  _List_node_base *p_Var7;
  ulong uVar8;
  size_type __n;
  long lVar9;
  long *plVar10;
  ulong uVar11;
  undefined1 auVar12 [16];
  pair<wasm::Function_*const,_wasm::ModuleUtils::(anonymous_namespace)::Counts> kv;
  __buckets_alloc_type __alloc;
  __node_base_ptr p_Stack_68;
  _List_node_base local_60;
  undefined8 local_50;
  InsertOrderedMap<wasm::Function_*,_wasm::ModuleUtils::(anonymous_namespace)::Counts> *local_48;
  undefined8 local_40;
  long *local_38;
  pointer __ptr;
  
  kv.second.super_InsertOrderedMap<wasm::HeapType,_unsigned_long>.List.
  super__List_base<std::pair<const_wasm::HeapType,_unsigned_long>,_std::allocator<std::pair<const_wasm::HeapType,_unsigned_long>_>_>
  ._M_impl._M_node._M_size = (size_t)&p_Stack_68;
  p_Stack_68 = (__node_base_ptr)0x0;
  local_50 = 0;
  local_60._M_next = &local_60;
  local_60._M_prev = &local_60;
  InsertOrderedMap<wasm::HeapType,_unsigned_long>::InsertOrderedMap
            ((InsertOrderedMap<wasm::HeapType,_unsigned_long> *)&kv,
             (InsertOrderedMap<wasm::HeapType,_unsigned_long> *)
             ((long)&kv.second.super_InsertOrderedMap<wasm::HeapType,_unsigned_long>.List.
                     super__List_base<std::pair<const_wasm::HeapType,_unsigned_long>,_std::allocator<std::pair<const_wasm::HeapType,_unsigned_long>_>_>
                     ._M_impl._M_node + 0x10));
  p_Var7 = local_60._M_next;
  while (p_Var7 != &local_60) {
    p_Var2 = p_Var7->_M_next;
    operator_delete(p_Var7,0x20);
    p_Var7 = p_Var2;
  }
  std::
  _Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_std::_List_iterator<std::pair<const_wasm::HeapType,_unsigned_long>_>_>,_std::allocator<std::pair<const_wasm::HeapType,_std::_List_iterator<std::pair<const_wasm::HeapType,_unsigned_long>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_std::_List_iterator<std::pair<const_wasm::HeapType,_unsigned_long>_>_>,_std::allocator<std::pair<const_wasm::HeapType,_std::_List_iterator<std::pair<const_wasm::HeapType,_unsigned_long>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)((long)&kv.second.super_InsertOrderedMap<wasm::HeapType,_unsigned_long>.List.
                           super__List_base<std::pair<const_wasm::HeapType,_unsigned_long>,_std::allocator<std::pair<const_wasm::HeapType,_unsigned_long>_>_>
                           ._M_impl._M_node + 0x10));
  local_38 = (long *)operator_new(0x18);
  *local_38 = 0;
  local_38[1] = (long)k;
  local_38[2] = (long)(this + 0x38);
  uVar11 = *(ulong *)(this + 8);
  uVar8 = (ulong)k % uVar11;
  plVar10 = *(long **)(*(long *)this + uVar8 * 8);
  if (plVar10 != (long *)0x0) {
    plVar10 = (long *)*plVar10;
    ppFVar3 = (Function **)plVar10[1];
    do {
      if (ppFVar3 == k) {
        operator_delete(local_38,0x18);
        lVar9 = plVar10[2];
        goto LAB_00a796fb;
      }
      plVar10 = (long *)*plVar10;
    } while ((plVar10 != (long *)0x0) &&
            (ppFVar3 = (Function **)plVar10[1], (ulong)ppFVar3 % uVar11 == uVar8));
  }
  local_40 = *(undefined8 *)(this + 0x28);
  local_48 = this + 0x38;
  auVar12 = std::__detail::_Prime_rehash_policy::_M_need_rehash
                      ((ulong)(this + 0x20),uVar11,*(ulong *)(this + 0x18));
  __n = auVar12._8_8_;
  if ((auVar12 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
    __s = *(InsertOrderedMap<wasm::Function_*,_wasm::ModuleUtils::(anonymous_namespace)::Counts> **)
           this;
  }
  else {
    if (__n == 1) {
      __s = this + 0x30;
      *(undefined8 *)(this + 0x30) = 0;
    }
    else {
      __s = (InsertOrderedMap<wasm::Function_*,_wasm::ModuleUtils::(anonymous_namespace)::Counts> *)
            __gnu_cxx::new_allocator<std::__detail::_Hash_node_base_*>::allocate
                      ((new_allocator<std::__detail::_Hash_node_base_*> *)
                       ((long)&kv.second.super_InsertOrderedMap<wasm::HeapType,_unsigned_long>.List.
                               super__List_base<std::pair<const_wasm::HeapType,_unsigned_long>,_std::allocator<std::pair<const_wasm::HeapType,_unsigned_long>_>_>
                               ._M_impl._M_node + 0x10),__n,(void *)0x0);
      memset(__s,0,__n * 8);
    }
    plVar10 = *(long **)(this + 0x10);
    *(undefined8 *)(this + 0x10) = 0;
    if (plVar10 != (long *)0x0) {
      pIVar1 = this + 0x10;
      uVar11 = 0;
      do {
        plVar4 = (long *)*plVar10;
        uVar8 = (ulong)plVar10[1] % __n;
        if (*(long **)(__s + uVar8 * 8) == (long *)0x0) {
          *plVar10 = *(long *)pIVar1;
          *(long **)pIVar1 = plVar10;
          *(InsertOrderedMap<wasm::Function_*,_wasm::ModuleUtils::(anonymous_namespace)::Counts> **)
           (__s + uVar8 * 8) = pIVar1;
          if (*plVar10 != 0) {
            pIVar6 = __s + uVar11 * 8;
            goto LAB_00a7962a;
          }
        }
        else {
          *plVar10 = **(long **)(__s + uVar8 * 8);
          pIVar6 = *(InsertOrderedMap<wasm::Function_*,_wasm::ModuleUtils::(anonymous_namespace)::Counts>
                     **)(__s + uVar8 * 8);
          uVar8 = uVar11;
LAB_00a7962a:
          *(long **)pIVar6 = plVar10;
        }
        plVar10 = plVar4;
        uVar11 = uVar8;
      } while (plVar4 != (long *)0x0);
    }
    if (this + 0x30 !=
        *(InsertOrderedMap<wasm::Function_*,_wasm::ModuleUtils::(anonymous_namespace)::Counts> **)
         this) {
      operator_delete(*(InsertOrderedMap<wasm::Function_*,_wasm::ModuleUtils::(anonymous_namespace)::Counts>
                        **)this,*(long *)(this + 8) << 3);
    }
    *(size_type *)(this + 8) = __n;
    *(InsertOrderedMap<wasm::Function_*,_wasm::ModuleUtils::(anonymous_namespace)::Counts> **)this =
         __s;
    uVar8 = (ulong)k % __n;
  }
  if (*(long **)(__s + uVar8 * 8) == (long *)0x0) {
    lVar9 = *(long *)(this + 0x10);
    *local_38 = lVar9;
    *(long **)(this + 0x10) = local_38;
    if (lVar9 != 0) {
      *(long **)(__s + (*(ulong *)(lVar9 + 8) % *(ulong *)(this + 8)) * 8) = local_38;
      __s = *(InsertOrderedMap<wasm::Function_*,_wasm::ModuleUtils::(anonymous_namespace)::Counts>
              **)this;
    }
    *(InsertOrderedMap<wasm::Function_*,_wasm::ModuleUtils::(anonymous_namespace)::Counts> **)
     (__s + uVar8 * 8) = this + 0x10;
  }
  else {
    *local_38 = **(long **)(__s + uVar8 * 8);
    **(undefined8 **)(__s + uVar8 * 8) = local_38;
  }
  *(long *)(this + 0x18) = *(long *)(this + 0x18) + 1;
  p_Var7 = (_List_node_base *)operator_new(0x68);
  p_Var7[1]._M_next = (_List_node_base *)k;
  InsertOrderedMap<wasm::HeapType,_unsigned_long>::InsertOrderedMap
            ((InsertOrderedMap<wasm::HeapType,_unsigned_long> *)&p_Var7[1]._M_prev,
             (InsertOrderedMap<wasm::HeapType,_unsigned_long> *)&kv);
  std::__detail::_List_node_base::_M_hook(p_Var7);
  *(long *)(this + 0x48) = *(long *)(this + 0x48) + 1;
  lVar9 = *(long *)(this + 0x40);
  local_38[2] = lVar9;
LAB_00a796fb:
  while (kv.second.super_InsertOrderedMap<wasm::HeapType,_unsigned_long>.Map._M_h._M_single_bucket
         != (__node_base_ptr)
            &kv.second.super_InsertOrderedMap<wasm::HeapType,_unsigned_long>.Map._M_h.
             _M_single_bucket) {
    p_Var5 = (kv.second.super_InsertOrderedMap<wasm::HeapType,_unsigned_long>.Map._M_h.
             _M_single_bucket)->_M_nxt;
    operator_delete(kv.second.super_InsertOrderedMap<wasm::HeapType,_unsigned_long>.Map._M_h.
                    _M_single_bucket,0x20);
    kv.second.super_InsertOrderedMap<wasm::HeapType,_unsigned_long>.Map._M_h._M_single_bucket =
         p_Var5;
  }
  std::
  _Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_std::_List_iterator<std::pair<const_wasm::HeapType,_unsigned_long>_>_>,_std::allocator<std::pair<const_wasm::HeapType,_std::_List_iterator<std::pair<const_wasm::HeapType,_unsigned_long>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_std::_List_iterator<std::pair<const_wasm::HeapType,_unsigned_long>_>_>,_std::allocator<std::pair<const_wasm::HeapType,_std::_List_iterator<std::pair<const_wasm::HeapType,_unsigned_long>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)&kv);
  return (Counts *)(lVar9 + 0x18);
}

Assistant:

T& operator[](const Key& k) {
    std::pair<const Key, T> kv = {k, {}};
    return insert(kv).first->second;
  }